

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_memoryDumpOutput_TestShell::
~TEST_MemoryLeakDetectorTest_memoryDumpOutput_TestShell
          (TEST_MemoryLeakDetectorTest_memoryDumpOutput_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, memoryDumpOutput)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 6);
    SimpleString::StrNCpy(mem, "test1", 6);
    SimpleString output = detector->report(mem_leak_period_checking);

    STRCMP_CONTAINS("Alloc num (1)", output.asCharString());
    STRCMP_CONTAINS("Leak size: 6 Allocated at",  output.asCharString());
    STRCMP_CONTAINS("Content:",  output.asCharString());
    STRCMP_CONTAINS("0000: 74 65 73 74 31 00                                |test1.|", output.asCharString());

    PlatformSpecificFree(mem);
}